

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::BVHNIntersector1<8,_16781328,_true,_embree::avx512::VirtualCurveIntersector1>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  undefined1 auVar4 [32];
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined8 uVar10;
  ulong uVar11;
  ulong uVar12;
  byte bVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [12];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  StackItemT<embree::NodeRefPtr<8>_> *pSVar20;
  uint uVar21;
  long lVar22;
  byte bVar23;
  AABBNodeMB4D *node1;
  undefined1 (*pauVar24) [32];
  byte bVar25;
  ulong uVar26;
  StackItemT<embree::NodeRefPtr<8>_> *pSVar27;
  ulong uVar28;
  ulong uVar29;
  bool bVar30;
  ulong uVar31;
  ulong uVar32;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar73 [64];
  float fVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar77;
  undefined4 uVar78;
  vfloat4 a0;
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [64];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [64];
  undefined1 auVar87 [16];
  float fVar88;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  long lStack_2580;
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 auVar38 [16];
  undefined1 auVar57 [32];
  int iVar33;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  
  stack[0].ptr.ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack[0].ptr.ptr != 8) {
    aVar3 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar36 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
    auVar17 = ZEXT812(0) << 0x20;
    auVar39 = ZEXT816(0) << 0x40;
    auVar35._4_12_ = auVar17;
    auVar35._0_4_ = auVar36._0_4_;
    auVar34 = vrsqrt14ss_avx512f(auVar39,auVar35);
    fVar77 = auVar34._0_4_;
    uVar1 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
    pre.depth_scale = fVar77 * 1.5 - auVar36._0_4_ * 0.5 * fVar77 * fVar77 * fVar77;
    uVar2 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
    fVar77 = (ray->super_RayK<1>).dir.field_0.m128[2];
    auVar79._0_4_ = aVar3.x * pre.depth_scale;
    auVar79._4_4_ = aVar3.y * pre.depth_scale;
    auVar79._8_4_ = aVar3.z * pre.depth_scale;
    auVar79._12_4_ = aVar3.field_3.w * pre.depth_scale;
    auVar34 = vshufpd_avx(auVar79,auVar79,1);
    auVar36 = vmovshdup_avx(auVar79);
    auVar89._8_4_ = 0x80000000;
    auVar89._0_8_ = 0x8000000080000000;
    auVar89._12_4_ = 0x80000000;
    auVar87._0_4_ = auVar36._0_4_ ^ 0x80000000;
    auVar36 = vunpckhps_avx(auVar79,auVar39);
    auVar87._4_12_ = auVar17;
    auVar37 = vshufps_avx(auVar36,auVar87,0x41);
    auVar84._0_8_ = auVar34._0_8_ ^ 0x8000000080000000;
    auVar84._8_8_ = auVar89._8_8_ ^ auVar34._8_8_;
    auVar35 = vinsertps_avx(auVar84,auVar79,0x2a);
    auVar36 = vdpps_avx(auVar37,auVar37,0x7f);
    auVar34 = vdpps_avx(auVar35,auVar35,0x7f);
    uVar10 = vcmpps_avx512vl(auVar34,auVar36,1);
    auVar36 = vpmovm2d_avx512vl(uVar10);
    auVar90._0_4_ = auVar36._0_4_;
    auVar90._4_4_ = auVar90._0_4_;
    auVar90._8_4_ = auVar90._0_4_;
    auVar90._12_4_ = auVar90._0_4_;
    uVar31 = vpmovd2m_avx512vl(auVar90);
    auVar36 = vpcmpeqd_avx(auVar90,auVar90);
    auVar34._4_4_ = (uint)((byte)(uVar31 >> 1) & 1) * auVar36._4_4_;
    auVar34._0_4_ = (uint)((byte)uVar31 & 1) * auVar36._0_4_;
    auVar34._8_4_ = (uint)((byte)(uVar31 >> 2) & 1) * auVar36._8_4_;
    auVar34._12_4_ = (uint)((byte)(uVar31 >> 3) & 1) * auVar36._12_4_;
    auVar36 = vblendvps_avx(auVar35,auVar37,auVar34);
    auVar34 = vdpps_avx(auVar36,auVar36,0x7f);
    auVar91._4_12_ = auVar17;
    auVar91._0_4_ = auVar34._0_4_;
    auVar35 = vrsqrt14ss_avx512f(auVar39,auVar91);
    fVar88 = auVar35._0_4_;
    fVar88 = fVar88 * 1.5 - fVar88 * fVar88 * fVar88 * auVar34._0_4_ * 0.5;
    auVar85._0_4_ = auVar36._0_4_ * fVar88;
    auVar85._4_4_ = auVar36._4_4_ * fVar88;
    auVar85._8_4_ = auVar36._8_4_ * fVar88;
    auVar85._12_4_ = auVar36._12_4_ * fVar88;
    auVar36 = vshufps_avx(auVar85,auVar85,0xc9);
    auVar34 = vshufps_avx(auVar79,auVar79,0xc9);
    auVar92._0_4_ = auVar34._0_4_ * auVar85._0_4_;
    auVar92._4_4_ = auVar34._4_4_ * auVar85._4_4_;
    auVar92._8_4_ = auVar34._8_4_ * auVar85._8_4_;
    auVar92._12_4_ = auVar34._12_4_ * auVar85._12_4_;
    auVar36 = vfmsub231ps_fma(auVar92,auVar79,auVar36);
    auVar34 = vshufps_avx(auVar36,auVar36,0xc9);
    auVar36 = vdpps_avx(auVar34,auVar34,0x7f);
    auVar96._4_12_ = auVar17;
    auVar96._0_4_ = auVar36._0_4_;
    auVar35 = vrsqrt14ss_avx512f(auVar39,auVar96);
    auVar98 = ZEXT1664(auVar35);
    fVar88 = auVar35._0_4_;
    fVar88 = fVar88 * 1.5 - fVar88 * fVar88 * fVar88 * auVar36._0_4_ * 0.5;
    auVar82._0_4_ = fVar88 * auVar34._0_4_;
    auVar82._4_4_ = fVar88 * auVar34._4_4_;
    auVar82._8_4_ = fVar88 * auVar34._8_4_;
    auVar82._12_4_ = fVar88 * auVar34._12_4_;
    auVar75._0_4_ = pre.depth_scale * auVar79._0_4_;
    auVar75._4_4_ = pre.depth_scale * auVar79._4_4_;
    auVar75._8_4_ = pre.depth_scale * auVar79._8_4_;
    auVar75._12_4_ = pre.depth_scale * auVar79._12_4_;
    auVar35 = vunpcklps_avx(auVar85,auVar75);
    auVar36 = vunpckhps_avx(auVar85,auVar75);
    auVar37 = vunpcklps_avx(auVar82,auVar39);
    auVar34 = vunpckhps_avx(auVar82,auVar39);
    pre.ray_space.vz.field_0 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar36,auVar34)
    ;
    pre.ray_space.vx.field_0 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar35,auVar37)
    ;
    pre.ray_space.vy.field_0 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar35,auVar37)
    ;
    pSVar27 = stack + 1;
    stack[0].dist = 0;
    auVar34 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar35 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar36._8_4_ = 0x7fffffff;
    auVar36._0_8_ = 0x7fffffff7fffffff;
    auVar36._12_4_ = 0x7fffffff;
    auVar36 = vandps_avx512vl((undefined1  [16])aVar3,auVar36);
    auVar37._8_4_ = 0x219392ef;
    auVar37._0_8_ = 0x219392ef219392ef;
    auVar37._12_4_ = 0x219392ef;
    uVar31 = vcmpps_avx512vl(auVar36,auVar37,1);
    auVar83._8_4_ = 0x3f800000;
    auVar83._0_8_ = 0x3f8000003f800000;
    auVar83._12_4_ = 0x3f800000;
    auVar36 = vdivps_avx(auVar83,(undefined1  [16])aVar3);
    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
    bVar30 = (bool)((byte)uVar31 & 1);
    auVar38._0_4_ = (uint)bVar30 * auVar37._0_4_ | (uint)!bVar30 * auVar36._0_4_;
    bVar30 = (bool)((byte)(uVar31 >> 1) & 1);
    auVar38._4_4_ = (uint)bVar30 * auVar37._4_4_ | (uint)!bVar30 * auVar36._4_4_;
    bVar30 = (bool)((byte)(uVar31 >> 2) & 1);
    auVar38._8_4_ = (uint)bVar30 * auVar37._8_4_ | (uint)!bVar30 * auVar36._8_4_;
    bVar30 = (bool)((byte)(uVar31 >> 3) & 1);
    auVar38._12_4_ = (uint)bVar30 * auVar37._12_4_ | (uint)!bVar30 * auVar36._12_4_;
    auVar39._8_4_ = 0x3f7ffffa;
    auVar39._0_8_ = 0x3f7ffffa3f7ffffa;
    auVar39._12_4_ = 0x3f7ffffa;
    auVar39 = vmulps_avx512vl(auVar38,auVar39);
    auVar40._8_4_ = 0x3f800003;
    auVar40._0_8_ = 0x3f8000033f800003;
    auVar40._12_4_ = 0x3f800003;
    auVar40 = vmulps_avx512vl(auVar38,auVar40);
    auVar41 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[0]));
    auVar42 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]));
    auVar43 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]));
    auVar44 = vbroadcastss_avx512vl(auVar39);
    auVar36 = vmovshdup_avx(auVar39);
    auVar45 = vbroadcastsd_avx512vl(auVar36);
    auVar37 = vshufpd_avx(auVar39,auVar39,1);
    auVar86 = ZEXT1664(auVar37);
    auVar49._8_4_ = 2;
    auVar49._0_8_ = 0x200000002;
    auVar49._12_4_ = 2;
    auVar49._16_4_ = 2;
    auVar49._20_4_ = 2;
    auVar49._24_4_ = 2;
    auVar49._28_4_ = 2;
    auVar46 = vpermps_avx512vl(auVar49,ZEXT1632(auVar39));
    auVar47 = vbroadcastss_avx512vl(auVar40);
    auVar48._8_4_ = 1;
    auVar48._0_8_ = 0x100000001;
    auVar48._12_4_ = 1;
    auVar48._16_4_ = 1;
    auVar48._20_4_ = 1;
    auVar48._24_4_ = 1;
    auVar48._28_4_ = 1;
    auVar48 = vpermps_avx512vl(auVar48,ZEXT1632(auVar40));
    auVar49 = vpermps_avx512vl(auVar49,ZEXT1632(auVar40));
    uVar31 = (ulong)(auVar39._0_4_ < 0.0);
    uVar29 = (ulong)(auVar36._0_4_ < 0.0) << 5 | 0x40;
    uVar28 = (ulong)(auVar37._0_4_ < 0.0) << 5 | 0x80;
    uVar26 = uVar31 * 0x20 ^ 0x20;
    auVar50 = vbroadcastss_avx512vl(auVar34);
    uVar78 = auVar35._0_4_;
    auVar73 = ZEXT3264(CONCAT428(uVar78,CONCAT424(uVar78,CONCAT420(uVar78,CONCAT416(uVar78,CONCAT412
                                                  (uVar78,CONCAT48(uVar78,CONCAT44(uVar78,uVar78))))
                                                  ))));
    auVar51 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
    auVar99 = ZEXT3264(auVar51);
    auVar51 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
    auVar100 = ZEXT3264(auVar51);
LAB_01c55661:
    if (pSVar27 != stack) {
      pSVar20 = pSVar27 + -1;
      pSVar27 = pSVar27 + -1;
      if ((float)pSVar20->dist <= (ray->super_RayK<1>).tfar) {
        uVar32 = (pSVar27->ptr).ptr;
LAB_01c5567d:
        do {
          fVar88 = (ray->super_RayK<1>).dir.field_0.m128[3];
          auVar76._4_4_ = fVar88;
          auVar76._0_4_ = fVar88;
          auVar76._8_4_ = fVar88;
          auVar76._12_4_ = fVar88;
          auVar51._16_4_ = fVar88;
          auVar51._0_16_ = auVar76;
          auVar51._20_4_ = fVar88;
          auVar51._24_4_ = fVar88;
          auVar51._28_4_ = fVar88;
          auVar36 = vsubss_avx512f(SUB6416(ZEXT464(0x3f800000),0),auVar76);
          fVar74 = auVar36._0_4_;
          auVar64._4_4_ = fVar74;
          auVar64._0_4_ = fVar74;
          auVar64._8_4_ = fVar74;
          auVar64._12_4_ = fVar74;
          auVar64._16_4_ = fVar74;
          auVar64._20_4_ = fVar74;
          auVar64._24_4_ = fVar74;
          auVar64._28_4_ = fVar74;
          do {
            if ((uVar32 & 8) != 0) {
              auVar86 = ZEXT1664(auVar86._0_16_);
              auVar98 = ZEXT1664(auVar98._0_16_);
              (**(code **)((long)This->leafIntersector +
                          (ulong)*(byte *)(uVar32 & 0xfffffffffffffff0) * 0x40))(&pre,ray,context);
              auVar51 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
              auVar100 = ZEXT3264(auVar51);
              auVar51 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
              auVar99 = ZEXT3264(auVar51);
              fVar88 = (ray->super_RayK<1>).tfar;
              auVar73 = ZEXT3264(CONCAT428(fVar88,CONCAT424(fVar88,CONCAT420(fVar88,CONCAT416(fVar88
                                                  ,CONCAT412(fVar88,CONCAT48(fVar88,CONCAT44(fVar88,
                                                  fVar88))))))));
              goto LAB_01c55661;
            }
            uVar21 = (uint)uVar32 & 7;
            pauVar24 = (undefined1 (*) [32])(uVar32 & 0xfffffffffffffff0);
            if (uVar21 == 3) {
              auVar52 = pauVar24[2];
              auVar53 = pauVar24[3];
              auVar54 = pauVar24[4];
              auVar55 = pauVar24[7];
              auVar56 = pauVar24[8];
              auVar65 = pauVar24[9];
              auVar4 = pauVar24[10];
              auVar81._0_4_ = fVar77 * auVar56._0_4_;
              auVar81._4_4_ = fVar77 * auVar56._4_4_;
              auVar81._8_4_ = fVar77 * auVar56._8_4_;
              auVar81._12_4_ = fVar77 * auVar56._12_4_;
              auVar81._16_4_ = fVar77 * auVar56._16_4_;
              auVar81._20_4_ = fVar77 * auVar56._20_4_;
              auVar81._28_36_ = auVar98._28_36_;
              auVar81._24_4_ = fVar77 * auVar56._24_4_;
              auVar98._0_4_ = fVar77 * auVar65._0_4_;
              auVar98._4_4_ = fVar77 * auVar65._4_4_;
              auVar98._8_4_ = fVar77 * auVar65._8_4_;
              auVar98._12_4_ = fVar77 * auVar65._12_4_;
              auVar98._16_4_ = fVar77 * auVar65._16_4_;
              auVar98._20_4_ = fVar77 * auVar65._20_4_;
              auVar98._28_36_ = auVar86._28_36_;
              auVar98._24_4_ = fVar77 * auVar65._24_4_;
              auVar58._4_4_ = fVar77 * auVar4._4_4_;
              auVar58._0_4_ = fVar77 * auVar4._0_4_;
              auVar58._8_4_ = fVar77 * auVar4._8_4_;
              auVar58._12_4_ = fVar77 * auVar4._12_4_;
              auVar58._16_4_ = fVar77 * auVar4._16_4_;
              auVar58._20_4_ = fVar77 * auVar4._20_4_;
              auVar58._24_4_ = fVar77 * auVar4._24_4_;
              auVar58._28_4_ = fVar77;
              auVar18._4_4_ = uVar2;
              auVar18._0_4_ = uVar2;
              auVar18._8_4_ = uVar2;
              auVar18._12_4_ = uVar2;
              auVar18._16_4_ = uVar2;
              auVar18._20_4_ = uVar2;
              auVar18._24_4_ = uVar2;
              auVar18._28_4_ = uVar2;
              auVar36 = vfmadd231ps_fma(auVar81._0_32_,auVar18,pauVar24[5]);
              auVar34 = vfmadd231ps_fma(auVar98._0_32_,auVar18,pauVar24[6]);
              auVar35 = vfmadd231ps_fma(auVar58,auVar18,auVar55);
              auVar19._4_4_ = uVar1;
              auVar19._0_4_ = uVar1;
              auVar19._8_4_ = uVar1;
              auVar19._12_4_ = uVar1;
              auVar19._16_4_ = uVar1;
              auVar19._20_4_ = uVar1;
              auVar19._24_4_ = uVar1;
              auVar19._28_4_ = uVar1;
              auVar36 = vfmadd231ps_fma(ZEXT1632(auVar36),auVar19,auVar52);
              auVar34 = vfmadd231ps_fma(ZEXT1632(auVar34),auVar19,auVar53);
              auVar35 = vfmadd231ps_fma(ZEXT1632(auVar35),auVar19,auVar54);
              auVar58 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              vandps_avx512vl(ZEXT1632(auVar36),auVar58);
              auVar59 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
              uVar32 = vcmpps_avx512vl(auVar58,auVar59,1);
              bVar30 = (bool)((byte)uVar32 & 1);
              iVar33 = auVar59._0_4_;
              auVar60._0_4_ = (uint)bVar30 * iVar33 | (uint)!bVar30 * auVar36._0_4_;
              bVar30 = (bool)((byte)(uVar32 >> 1) & 1);
              iVar66 = auVar59._4_4_;
              auVar60._4_4_ = (uint)bVar30 * iVar66 | (uint)!bVar30 * auVar36._4_4_;
              bVar30 = (bool)((byte)(uVar32 >> 2) & 1);
              iVar67 = auVar59._8_4_;
              auVar60._8_4_ = (uint)bVar30 * iVar67 | (uint)!bVar30 * auVar36._8_4_;
              bVar30 = (bool)((byte)(uVar32 >> 3) & 1);
              iVar68 = auVar59._12_4_;
              auVar60._12_4_ = (uint)bVar30 * iVar68 | (uint)!bVar30 * auVar36._12_4_;
              iVar69 = auVar59._16_4_;
              auVar60._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * iVar69;
              iVar70 = auVar59._20_4_;
              auVar60._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * iVar70;
              iVar71 = auVar59._24_4_;
              iVar72 = auVar59._28_4_;
              auVar60._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * iVar71;
              auVar60._28_4_ = (uint)(byte)(uVar32 >> 7) * iVar72;
              vandps_avx512vl(ZEXT1632(auVar34),auVar58);
              uVar32 = vcmpps_avx512vl(auVar60,auVar59,1);
              bVar30 = (bool)((byte)uVar32 & 1);
              auVar61._0_4_ = (uint)bVar30 * iVar33 | (uint)!bVar30 * auVar34._0_4_;
              bVar30 = (bool)((byte)(uVar32 >> 1) & 1);
              auVar61._4_4_ = (uint)bVar30 * iVar66 | (uint)!bVar30 * auVar34._4_4_;
              bVar30 = (bool)((byte)(uVar32 >> 2) & 1);
              auVar61._8_4_ = (uint)bVar30 * iVar67 | (uint)!bVar30 * auVar34._8_4_;
              bVar30 = (bool)((byte)(uVar32 >> 3) & 1);
              auVar61._12_4_ = (uint)bVar30 * iVar68 | (uint)!bVar30 * auVar34._12_4_;
              auVar61._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * iVar69;
              auVar61._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * iVar70;
              auVar61._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * iVar71;
              auVar61._28_4_ = (uint)(byte)(uVar32 >> 7) * iVar72;
              vandps_avx512vl(ZEXT1632(auVar35),auVar58);
              uVar32 = vcmpps_avx512vl(auVar61,auVar59,1);
              bVar30 = (bool)((byte)uVar32 & 1);
              auVar62._0_4_ = (uint)bVar30 * iVar33 | (uint)!bVar30 * auVar35._0_4_;
              bVar30 = (bool)((byte)(uVar32 >> 1) & 1);
              auVar62._4_4_ = (uint)bVar30 * iVar66 | (uint)!bVar30 * auVar35._4_4_;
              bVar30 = (bool)((byte)(uVar32 >> 2) & 1);
              auVar62._8_4_ = (uint)bVar30 * iVar67 | (uint)!bVar30 * auVar35._8_4_;
              bVar30 = (bool)((byte)(uVar32 >> 3) & 1);
              auVar62._12_4_ = (uint)bVar30 * iVar68 | (uint)!bVar30 * auVar35._12_4_;
              auVar62._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * iVar69;
              auVar62._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * iVar70;
              auVar62._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * iVar71;
              auVar62._28_4_ = (uint)(byte)(uVar32 >> 7) * iVar72;
              auVar58 = vrcp14ps_avx512vl(auVar60);
              auVar59 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar63 = vfnmadd213ps_avx512vl(auVar60,auVar58,auVar59);
              auVar36 = vfmadd132ps_fma(auVar63,auVar58,auVar58);
              auVar58 = vrcp14ps_avx512vl(auVar61);
              auVar63 = vfnmadd213ps_avx512vl(auVar61,auVar58,auVar59);
              auVar34 = vfmadd132ps_fma(auVar63,auVar58,auVar58);
              auVar58 = vrcp14ps_avx512vl(auVar62);
              auVar59 = vfnmadd213ps_avx512vl(auVar62,auVar58,auVar59);
              auVar35 = vfmadd132ps_fma(auVar59,auVar58,auVar58);
              auVar56 = vfmadd213ps_avx512vl(auVar56,auVar43,pauVar24[0xb]);
              auVar58 = vfmadd231ps_avx512vl(auVar56,auVar42,pauVar24[5]);
              auVar56 = vfmadd213ps_avx512vl(auVar65,auVar43,pauVar24[0xc]);
              auVar59 = vfmadd231ps_avx512vl(auVar56,auVar42,pauVar24[6]);
              auVar56 = vfmadd213ps_avx512vl(auVar4,auVar43,pauVar24[0xd]);
              auVar63 = vfmadd231ps_avx512vl(auVar56,auVar42,auVar55);
              auVar56._4_4_ = fVar88 * *(float *)(pauVar24[0xe] + 4);
              auVar56._0_4_ = fVar88 * *(float *)pauVar24[0xe];
              auVar56._8_4_ = fVar88 * *(float *)(pauVar24[0xe] + 8);
              auVar56._12_4_ = fVar88 * *(float *)(pauVar24[0xe] + 0xc);
              auVar56._16_4_ = fVar88 * *(float *)(pauVar24[0xe] + 0x10);
              auVar56._20_4_ = fVar88 * *(float *)(pauVar24[0xe] + 0x14);
              auVar56._24_4_ = fVar88 * *(float *)(pauVar24[0xe] + 0x18);
              auVar56._28_4_ = auVar55._28_4_;
              auVar55 = vfmadd231ps_avx512vl(auVar58,auVar41,auVar52);
              auVar65._4_4_ = fVar88 * *(float *)(pauVar24[0xf] + 4);
              auVar65._0_4_ = fVar88 * *(float *)pauVar24[0xf];
              auVar65._8_4_ = fVar88 * *(float *)(pauVar24[0xf] + 8);
              auVar65._12_4_ = fVar88 * *(float *)(pauVar24[0xf] + 0xc);
              auVar65._16_4_ = fVar88 * *(float *)(pauVar24[0xf] + 0x10);
              auVar65._20_4_ = fVar88 * *(float *)(pauVar24[0xf] + 0x14);
              auVar65._24_4_ = fVar88 * *(float *)(pauVar24[0xf] + 0x18);
              auVar65._28_4_ = auVar52._28_4_;
              auVar58 = vfmadd231ps_avx512vl(auVar59,auVar41,auVar53);
              auVar4._4_4_ = fVar88 * *(float *)(pauVar24[0x10] + 4);
              auVar4._0_4_ = fVar88 * *(float *)pauVar24[0x10];
              auVar4._8_4_ = fVar88 * *(float *)(pauVar24[0x10] + 8);
              auVar4._12_4_ = fVar88 * *(float *)(pauVar24[0x10] + 0xc);
              auVar4._16_4_ = fVar88 * *(float *)(pauVar24[0x10] + 0x10);
              auVar4._20_4_ = fVar88 * *(float *)(pauVar24[0x10] + 0x14);
              auVar4._24_4_ = fVar88 * *(float *)(pauVar24[0x10] + 0x18);
              auVar4._28_4_ = auVar53._28_4_;
              auVar37 = vfmadd231ps_fma(auVar56,auVar64,ZEXT832(0) << 0x20);
              auVar59 = vfmadd231ps_avx512vl(auVar63,auVar41,auVar54);
              auVar39 = vfmadd231ps_fma(auVar65,auVar64,ZEXT832(0) << 0x20);
              auVar93._0_4_ = fVar88 * *(float *)pauVar24[0x11] + fVar74;
              auVar93._4_4_ = fVar88 * *(float *)(pauVar24[0x11] + 4) + fVar74;
              auVar93._8_4_ = fVar88 * *(float *)(pauVar24[0x11] + 8) + fVar74;
              auVar93._12_4_ = fVar88 * *(float *)(pauVar24[0x11] + 0xc) + fVar74;
              auVar93._16_4_ = fVar88 * *(float *)(pauVar24[0x11] + 0x10) + fVar74;
              auVar93._20_4_ = fVar88 * *(float *)(pauVar24[0x11] + 0x14) + fVar74;
              auVar93._24_4_ = fVar88 * *(float *)(pauVar24[0x11] + 0x18) + fVar74;
              auVar93._28_4_ = auVar54._28_4_ + fVar74;
              auVar52 = vsubps_avx(ZEXT1632(auVar37),auVar55);
              auVar53 = vsubps_avx(auVar93,auVar55);
              auVar37 = vfmadd231ps_fma(auVar4,auVar64,ZEXT832(0) << 0x20);
              auVar94._0_4_ = fVar88 * *(float *)pauVar24[0x12] + fVar74;
              auVar94._4_4_ = fVar88 * *(float *)(pauVar24[0x12] + 4) + fVar74;
              auVar94._8_4_ = fVar88 * *(float *)(pauVar24[0x12] + 8) + fVar74;
              auVar94._12_4_ = fVar88 * *(float *)(pauVar24[0x12] + 0xc) + fVar74;
              auVar94._16_4_ = fVar88 * *(float *)(pauVar24[0x12] + 0x10) + fVar74;
              auVar94._20_4_ = fVar88 * *(float *)(pauVar24[0x12] + 0x14) + fVar74;
              auVar94._24_4_ = fVar88 * *(float *)(pauVar24[0x12] + 0x18) + fVar74;
              auVar94._28_4_ = auVar93._28_4_ + fVar74;
              auVar54 = vsubps_avx(ZEXT1632(auVar39),auVar58);
              auVar55 = vsubps_avx(auVar94,auVar58);
              auVar95._0_4_ = fVar88 * *(float *)pauVar24[0x13] + fVar74;
              auVar95._4_4_ = fVar88 * *(float *)(pauVar24[0x13] + 4) + fVar74;
              auVar95._8_4_ = fVar88 * *(float *)(pauVar24[0x13] + 8) + fVar74;
              auVar95._12_4_ = fVar88 * *(float *)(pauVar24[0x13] + 0xc) + fVar74;
              auVar95._16_4_ = fVar88 * *(float *)(pauVar24[0x13] + 0x10) + fVar74;
              auVar95._20_4_ = fVar88 * *(float *)(pauVar24[0x13] + 0x14) + fVar74;
              auVar95._24_4_ = fVar88 * *(float *)(pauVar24[0x13] + 0x18) + fVar74;
              auVar95._28_4_ = auVar94._28_4_ + fVar74;
              auVar56 = vsubps_avx(ZEXT1632(auVar37),auVar59);
              auVar65 = vsubps_avx(auVar95,auVar59);
              auVar59._4_4_ = auVar52._4_4_ * auVar36._4_4_;
              auVar59._0_4_ = auVar52._0_4_ * auVar36._0_4_;
              auVar59._8_4_ = auVar52._8_4_ * auVar36._8_4_;
              auVar59._12_4_ = auVar52._12_4_ * auVar36._12_4_;
              auVar59._16_4_ = auVar52._16_4_ * 0.0;
              auVar59._20_4_ = auVar52._20_4_ * 0.0;
              auVar59._24_4_ = auVar52._24_4_ * 0.0;
              auVar59._28_4_ = auVar95._28_4_;
              auVar63._4_4_ = auVar36._4_4_ * auVar53._4_4_;
              auVar63._0_4_ = auVar36._0_4_ * auVar53._0_4_;
              auVar63._8_4_ = auVar36._8_4_ * auVar53._8_4_;
              auVar63._12_4_ = auVar36._12_4_ * auVar53._12_4_;
              auVar63._16_4_ = auVar53._16_4_ * 0.0;
              auVar63._20_4_ = auVar53._20_4_ * 0.0;
              auVar63._24_4_ = auVar53._24_4_ * 0.0;
              auVar63._28_4_ = auVar53._28_4_;
              auVar97._0_4_ = auVar54._0_4_ * auVar34._0_4_;
              auVar97._4_4_ = auVar54._4_4_ * auVar34._4_4_;
              auVar97._8_4_ = auVar54._8_4_ * auVar34._8_4_;
              auVar97._12_4_ = auVar54._12_4_ * auVar34._12_4_;
              auVar97._16_4_ = auVar54._16_4_ * 0.0;
              auVar97._20_4_ = auVar54._20_4_ * 0.0;
              auVar97._24_4_ = auVar54._24_4_ * 0.0;
              auVar97._28_4_ = 0;
              auVar98 = ZEXT3264(auVar97);
              auVar14._4_4_ = auVar56._4_4_ * auVar35._4_4_;
              auVar14._0_4_ = auVar56._0_4_ * auVar35._0_4_;
              auVar14._8_4_ = auVar56._8_4_ * auVar35._8_4_;
              auVar14._12_4_ = auVar56._12_4_ * auVar35._12_4_;
              auVar14._16_4_ = auVar56._16_4_ * 0.0;
              auVar14._20_4_ = auVar56._20_4_ * 0.0;
              auVar14._24_4_ = auVar56._24_4_ * 0.0;
              auVar14._28_4_ = auVar56._28_4_;
              auVar15._4_4_ = auVar55._4_4_ * auVar34._4_4_;
              auVar15._0_4_ = auVar55._0_4_ * auVar34._0_4_;
              auVar15._8_4_ = auVar55._8_4_ * auVar34._8_4_;
              auVar15._12_4_ = auVar55._12_4_ * auVar34._12_4_;
              auVar15._16_4_ = auVar55._16_4_ * 0.0;
              auVar15._20_4_ = auVar55._20_4_ * 0.0;
              auVar15._24_4_ = auVar55._24_4_ * 0.0;
              auVar15._28_4_ = auVar55._28_4_;
              auVar16._4_4_ = auVar65._4_4_ * auVar35._4_4_;
              auVar16._0_4_ = auVar65._0_4_ * auVar35._0_4_;
              auVar16._8_4_ = auVar65._8_4_ * auVar35._8_4_;
              auVar16._12_4_ = auVar65._12_4_ * auVar35._12_4_;
              auVar16._16_4_ = auVar65._16_4_ * 0.0;
              auVar16._20_4_ = auVar65._20_4_ * 0.0;
              auVar16._24_4_ = auVar65._24_4_ * 0.0;
              auVar16._28_4_ = auVar65._28_4_;
              auVar52 = vpminsd_avx2(auVar97,auVar15);
              auVar53 = vpminsd_avx2(auVar14,auVar16);
              auVar52 = vmaxps_avx(auVar52,auVar53);
              auVar86 = ZEXT3264(auVar52);
              auVar56 = vpminsd_avx2(auVar59,auVar63);
              auVar54 = vpmaxsd_avx2(auVar59,auVar63);
              auVar53 = vpmaxsd_avx2(auVar97,auVar15);
              auVar55 = vpmaxsd_avx2(auVar14,auVar16);
              auVar53 = vminps_avx(auVar53,auVar55);
              auVar55 = vmaxps_avx512vl(auVar50,auVar56);
              auVar52 = vmaxps_avx(auVar55,auVar52);
              auVar54 = vminps_avx(auVar73._0_32_,auVar54);
              auVar53 = vminps_avx(auVar54,auVar53);
              auVar54._8_4_ = 0x3f7ffffa;
              auVar54._0_8_ = 0x3f7ffffa3f7ffffa;
              auVar54._12_4_ = 0x3f7ffffa;
              auVar54._16_4_ = 0x3f7ffffa;
              auVar54._20_4_ = 0x3f7ffffa;
              auVar54._24_4_ = 0x3f7ffffa;
              auVar54._28_4_ = 0x3f7ffffa;
              auVar52 = vmulps_avx512vl(auVar52,auVar54);
              auVar55._8_4_ = 0x3f800003;
              auVar55._0_8_ = 0x3f8000033f800003;
              auVar55._12_4_ = 0x3f800003;
              auVar55._16_4_ = 0x3f800003;
              auVar55._20_4_ = 0x3f800003;
              auVar55._24_4_ = 0x3f800003;
              auVar55._28_4_ = 0x3f800003;
              auVar53 = vmulps_avx512vl(auVar53,auVar55);
LAB_01c55779:
              uVar32 = vcmpps_avx512vl(auVar52,auVar53,2);
            }
            else {
              auVar36 = vfmadd213ps_fma(pauVar24[uVar31 + 8],auVar51,pauVar24[uVar31 + 2]);
              auVar52 = vsubps_avx512vl(ZEXT1632(auVar36),auVar41);
              auVar53 = vmulps_avx512vl(auVar44,auVar52);
              auVar36 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar24[8] + uVar29),auVar51,
                                        *(undefined1 (*) [32])(pauVar24[2] + uVar29));
              auVar52 = vsubps_avx512vl(ZEXT1632(auVar36),auVar42);
              auVar52 = vmulps_avx512vl(auVar45,auVar52);
              auVar36 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar24[8] + uVar28),auVar51,
                                        *(undefined1 (*) [32])(pauVar24[2] + uVar28));
              auVar54 = vsubps_avx512vl(ZEXT1632(auVar36),auVar43);
              auVar54 = vmulps_avx512vl(auVar46,auVar54);
              auVar52 = vmaxps_avx(auVar52,auVar54);
              auVar53 = vmaxps_avx512vl(auVar50,auVar53);
              auVar52 = vmaxps_avx(auVar53,auVar52);
              auVar36 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar24[8] + uVar26),auVar51,
                                        *(undefined1 (*) [32])(pauVar24[2] + uVar26));
              auVar53 = vsubps_avx512vl(ZEXT1632(auVar36),auVar41);
              auVar54 = vmulps_avx512vl(auVar47,auVar53);
              auVar36 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar24[8] + (uVar29 ^ 0x20)),
                                        auVar51,*(undefined1 (*) [32])
                                                 (pauVar24[2] + (uVar29 ^ 0x20)));
              auVar53 = vsubps_avx512vl(ZEXT1632(auVar36),auVar42);
              auVar53 = vmulps_avx512vl(auVar48,auVar53);
              auVar36 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar24[8] + (uVar28 ^ 0x20)),
                                        auVar51,*(undefined1 (*) [32])
                                                 (pauVar24[2] + (uVar28 ^ 0x20)));
              auVar55 = vsubps_avx512vl(ZEXT1632(auVar36),auVar43);
              auVar55 = vmulps_avx512vl(auVar49,auVar55);
              auVar86 = ZEXT3264(auVar55);
              auVar53 = vminps_avx(auVar53,auVar55);
              auVar54 = vminps_avx(auVar73._0_32_,auVar54);
              auVar53 = vminps_avx(auVar54,auVar53);
              if (uVar21 != 6) goto LAB_01c55779;
              uVar11 = vcmpps_avx512vl(auVar52,auVar53,2);
              uVar12 = vcmpps_avx512vl(auVar51,pauVar24[0xe],0xd);
              uVar32 = vcmpps_avx512vl(auVar51,pauVar24[0xf],1);
              uVar32 = uVar11 & uVar12 & uVar32;
            }
            bVar25 = (byte)uVar32;
            if (bVar25 == 0) goto LAB_01c55661;
            auVar53 = *pauVar24;
            auVar54 = pauVar24[1];
            auVar55 = vmovdqa64_avx512vl(auVar99._0_32_);
            auVar55 = vpternlogd_avx512vl(auVar55,auVar52,auVar100._0_32_,0xf8);
            auVar56 = vpcompressd_avx512vl(auVar55);
            auVar57._0_4_ =
                 (uint)(bVar25 & 1) * auVar56._0_4_ | (uint)!(bool)(bVar25 & 1) * auVar55._0_4_;
            bVar30 = (bool)((byte)(uVar32 >> 1) & 1);
            auVar57._4_4_ = (uint)bVar30 * auVar56._4_4_ | (uint)!bVar30 * auVar55._4_4_;
            bVar30 = (bool)((byte)(uVar32 >> 2) & 1);
            auVar57._8_4_ = (uint)bVar30 * auVar56._8_4_ | (uint)!bVar30 * auVar55._8_4_;
            bVar30 = (bool)((byte)(uVar32 >> 3) & 1);
            auVar57._12_4_ = (uint)bVar30 * auVar56._12_4_ | (uint)!bVar30 * auVar55._12_4_;
            bVar30 = (bool)((byte)(uVar32 >> 4) & 1);
            auVar57._16_4_ = (uint)bVar30 * auVar56._16_4_ | (uint)!bVar30 * auVar55._16_4_;
            bVar30 = (bool)((byte)(uVar32 >> 5) & 1);
            auVar57._20_4_ = (uint)bVar30 * auVar56._20_4_ | (uint)!bVar30 * auVar55._20_4_;
            bVar30 = (bool)((byte)(uVar32 >> 6) & 1);
            auVar57._24_4_ = (uint)bVar30 * auVar56._24_4_ | (uint)!bVar30 * auVar55._24_4_;
            bVar30 = SUB81(uVar32 >> 7,0);
            auVar57._28_4_ = (uint)bVar30 * auVar56._28_4_ | (uint)!bVar30 * auVar55._28_4_;
            auVar86 = ZEXT3264(auVar57);
            auVar55 = vpermt2q_avx512vl(auVar53,auVar57,auVar54);
            uVar32 = auVar55._0_8_;
            bVar25 = bVar25 - 1 & bVar25;
          } while (bVar25 == 0);
          auVar51 = vpshufd_avx2(auVar57,0x55);
          vpermt2q_avx512vl(auVar53,auVar51,auVar54);
          auVar64 = vpminsd_avx2(auVar57,auVar51);
          auVar51 = vpmaxsd_avx2(auVar57,auVar51);
          bVar25 = bVar25 - 1 & bVar25;
          if (bVar25 == 0) {
            auVar64 = vpermi2q_avx512vl(auVar64,auVar53,auVar54);
            uVar32 = auVar64._0_8_;
            auVar64 = vpermt2q_avx512vl(auVar53,auVar51,auVar54);
            (pSVar27->ptr).ptr = auVar64._0_8_;
            lVar22 = 8;
            lStack_2580 = 0x10;
LAB_01c55a61:
            auVar51 = vpermd_avx2(auVar51,auVar52);
            *(int *)((long)&(pSVar27->ptr).ptr + lVar22) = auVar51._0_4_;
            pSVar27 = (StackItemT<embree::NodeRefPtr<8>_> *)
                      ((long)&(pSVar27->ptr).ptr + lStack_2580);
            goto LAB_01c5567d;
          }
          auVar56 = vpshufd_avx2(auVar57,0xaa);
          vpermt2q_avx512vl(auVar53,auVar56,auVar54);
          auVar55 = vpminsd_avx2(auVar64,auVar56);
          auVar64 = vpmaxsd_avx2(auVar64,auVar56);
          auVar56 = vpminsd_avx2(auVar51,auVar64);
          auVar64 = vpmaxsd_avx2(auVar51,auVar64);
          bVar25 = bVar25 - 1 & bVar25;
          if (bVar25 == 0) {
            auVar51 = vpermi2q_avx512vl(auVar55,auVar53,auVar54);
            uVar32 = auVar51._0_8_;
            auVar51 = vpermt2q_avx512vl(auVar53,auVar64,auVar54);
            (pSVar27->ptr).ptr = auVar51._0_8_;
            auVar51 = vpermd_avx2(auVar64,auVar52);
            pSVar27->dist = auVar51._0_4_;
            auVar51 = vpermt2q_avx512vl(auVar53,auVar56,auVar54);
            pSVar27[1].ptr.ptr = auVar51._0_8_;
            lStack_2580 = 0x18;
            lVar22 = lStack_2580;
            lStack_2580 = 0x20;
            auVar51 = auVar56;
            goto LAB_01c55a61;
          }
          auVar51 = vpshufd_avx2(auVar57,0xff);
          vpermt2q_avx512vl(auVar53,auVar51,auVar54);
          auVar65 = vpminsd_avx2(auVar55,auVar51);
          auVar55 = vpmaxsd_avx2(auVar55,auVar51);
          auVar51 = vpminsd_avx2(auVar56,auVar55);
          auVar55 = vpmaxsd_avx2(auVar56,auVar55);
          auVar56 = vpminsd_avx2(auVar64,auVar55);
          auVar64 = vpmaxsd_avx2(auVar64,auVar55);
          bVar25 = bVar25 - 1 & bVar25;
          if (bVar25 == 0) {
            auVar55 = vpermi2q_avx512vl(auVar65,auVar53,auVar54);
            auVar98 = ZEXT3264(auVar55);
            uVar32 = auVar55._0_8_;
            auVar55 = vpermt2q_avx512vl(auVar53,auVar64,auVar54);
            (pSVar27->ptr).ptr = auVar55._0_8_;
            auVar64 = vpermd_avx2(auVar64,auVar52);
            pSVar27->dist = auVar64._0_4_;
            auVar64 = vpermt2q_avx512vl(auVar53,auVar56,auVar54);
            pSVar27[1].ptr.ptr = auVar64._0_8_;
            auVar64 = vpermd_avx2(auVar56,auVar52);
            pSVar27[1].dist = auVar64._0_4_;
            auVar64 = vpermt2q_avx512vl(auVar53,auVar51,auVar54);
            pSVar27[2].ptr.ptr = auVar64._0_8_;
            lVar22 = 0x28;
            lStack_2580 = 0x30;
            goto LAB_01c55a61;
          }
          auVar55 = valignd_avx512vl(auVar57,auVar57,3);
          auVar86 = ZEXT3264(auVar55);
          auVar55 = vpmovsxbd_avx2(ZEXT816(0x303020108));
          auVar65 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                         CONCAT48(0x80000000,0x8000000080000000))),
                                      auVar55,auVar65);
          auVar55 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
          auVar98 = ZEXT3264(auVar55);
          auVar51 = vpermt2d_avx512vl(auVar65,auVar55,auVar51);
          auVar55 = vpermt2d_avx512vl(auVar51,auVar55,auVar56);
          auVar51 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
          auVar51 = vpermt2d_avx512vl(auVar55,auVar51,auVar64);
          auVar81 = ZEXT3264(auVar51);
          bVar23 = bVar25;
          do {
            auVar55 = auVar81._0_32_;
            auVar80._8_4_ = 1;
            auVar80._0_8_ = 0x100000001;
            auVar80._12_4_ = 1;
            auVar80._16_4_ = 1;
            auVar80._20_4_ = 1;
            auVar80._24_4_ = 1;
            auVar80._28_4_ = 1;
            auVar64 = auVar86._0_32_;
            auVar51 = vpermd_avx2(auVar80,auVar64);
            auVar64 = valignd_avx512vl(auVar64,auVar64,1);
            auVar86 = ZEXT3264(auVar64);
            vpermt2q_avx512vl(auVar53,auVar64,auVar54);
            bVar23 = bVar23 - 1 & bVar23;
            uVar10 = vpcmpd_avx512vl(auVar51,auVar55,5);
            auVar51 = vpmaxsd_avx2(auVar51,auVar55);
            bVar13 = (byte)uVar10 << 1;
            auVar64 = valignd_avx512vl(auVar55,auVar55,7);
            bVar30 = (bool)((byte)uVar10 & 1);
            bVar5 = (bool)(bVar13 >> 2 & 1);
            bVar6 = (bool)(bVar13 >> 3 & 1);
            bVar7 = (bool)(bVar13 >> 4 & 1);
            bVar8 = (bool)(bVar13 >> 5 & 1);
            bVar9 = (bool)(bVar13 >> 6 & 1);
            auVar81 = ZEXT3264(CONCAT428((uint)(bVar13 >> 7) * auVar64._28_4_ |
                                         (uint)!(bool)(bVar13 >> 7) * auVar51._28_4_,
                                         CONCAT424((uint)bVar9 * auVar64._24_4_ |
                                                   (uint)!bVar9 * auVar51._24_4_,
                                                   CONCAT420((uint)bVar8 * auVar64._20_4_ |
                                                             (uint)!bVar8 * auVar51._20_4_,
                                                             CONCAT416((uint)bVar7 * auVar64._16_4_
                                                                       | (uint)!bVar7 *
                                                                         auVar51._16_4_,
                                                                       CONCAT412((uint)bVar6 *
                                                                                 auVar64._12_4_ |
                                                                                 (uint)!bVar6 *
                                                                                 auVar51._12_4_,
                                                                                 CONCAT48((uint)
                                                  bVar5 * auVar64._8_4_ |
                                                  (uint)!bVar5 * auVar51._8_4_,
                                                  CONCAT44((uint)bVar30 * auVar64._4_4_ |
                                                           (uint)!bVar30 * auVar51._4_4_,
                                                           auVar51._0_4_))))))));
          } while (bVar23 != 0);
          lVar22 = (ulong)(uint)POPCOUNT((uint)bVar25) + 3;
          while( true ) {
            auVar64 = auVar81._0_32_;
            auVar51 = vpermt2q_avx512vl(auVar53,auVar64,auVar54);
            uVar32 = auVar51._0_8_;
            bVar30 = lVar22 == 0;
            lVar22 = lVar22 + -1;
            if (bVar30) break;
            (pSVar27->ptr).ptr = uVar32;
            auVar51 = vpermd_avx2(auVar64,auVar52);
            pSVar27->dist = auVar51._0_4_;
            auVar51 = valignd_avx512vl(auVar64,auVar64,1);
            auVar81 = ZEXT3264(auVar51);
            pSVar27 = pSVar27 + 1;
          }
        } while( true );
      }
      goto LAB_01c55661;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }